

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O3

void BuilderTests<GrpcLikeMessageBuilder,_GrpcLikeMessageBuilder>::nonempty_builder_movector_test
               (void)

{
  ulong expval;
  GrpcLikeMessageBuilder src;
  GrpcLikeMessageBuilder dst;
  GrpcLikeMessageBuilder local_128;
  GrpcLikeMessageBuilder local_a0;
  
  local_128.super_FlatBufferBuilder.buf_.allocator_ = (Allocator *)&local_128;
  local_128.super_AllocatorMember.member_allocator_.super_Allocator._vptr_Allocator =
       (DefaultAllocator)&PTR__Allocator_001fad28;
  local_128.super_FlatBufferBuilder.buf_.own_allocator_ = false;
  local_128.super_FlatBufferBuilder.buf_.initial_size_ = 0x400;
  local_128.super_FlatBufferBuilder.buf_.max_size_ = 0x7fffffff;
  local_128.super_FlatBufferBuilder.buf_.buffer_minalign_ = 8;
  local_128.super_FlatBufferBuilder.buf_.reserved_ = 0;
  local_128.super_FlatBufferBuilder.buf_.size_ = 0;
  local_128.super_FlatBufferBuilder.length_of_64_bit_region_ = 0;
  local_128.super_FlatBufferBuilder.nested = false;
  local_128.super_FlatBufferBuilder.finished = false;
  local_128.super_FlatBufferBuilder.buf_.buf_ = (uint8_t *)0x0;
  local_128.super_FlatBufferBuilder.buf_.cur_._0_6_ = 0;
  local_128.super_FlatBufferBuilder.buf_.cur_._6_2_ = 0;
  local_128.super_FlatBufferBuilder.buf_.scratch_._0_6_ = 0;
  local_128.super_FlatBufferBuilder._78_8_ = 0;
  local_128.super_FlatBufferBuilder.minalign_ = 1;
  local_128.super_FlatBufferBuilder.force_defaults_ = false;
  local_128.super_FlatBufferBuilder.dedup_vtables_ = true;
  local_128.super_FlatBufferBuilder.string_pool = (StringOffsetMap *)0x0;
  populate1(&local_128.super_FlatBufferBuilder);
  expval = (ulong)local_128.super_FlatBufferBuilder.buf_.size_;
  GrpcLikeMessageBuilder::GrpcLikeMessageBuilder(&local_a0,&local_128);
  TestEq<unsigned_long,unsigned_int>
            (expval,local_a0.super_FlatBufferBuilder.buf_.size_,"\'src_size\' != \'dst.GetSize()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x60,
             "static void BuilderTests<GrpcLikeMessageBuilder>::nonempty_builder_movector_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
            );
  TestEq<unsigned_int,int>
            (local_128.super_FlatBufferBuilder.buf_.size_,0,"\'src.GetSize()\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x61,
             "static void BuilderTests<GrpcLikeMessageBuilder>::nonempty_builder_movector_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
            );
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
            (&local_a0.super_FlatBufferBuilder);
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
            (&local_128.super_FlatBufferBuilder);
  return;
}

Assistant:

inline MyGame::Example::Color m2_color() {
  return MyGame::Example::Color_Green;
}